

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O3

bool __thiscall
QAbstractSliderPrivate::scrollByDelta
          (QAbstractSliderPrivate *this,Orientation orientation,KeyboardModifiers modifiers,
          int delta)

{
  QAbstractSlider *this_00;
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  
  iVar3 = -delta;
  if (orientation != Horizontal) {
    iVar3 = delta;
  }
  this_00 = *(QAbstractSlider **)&(this->super_QWidgetPrivate).field_0x8;
  fVar1 = (float)iVar3 / 120.0;
  if (((uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
             super_QFlagsStorage<Qt::KeyboardModifier>.i & 0x6000000) == 0) {
    iVar3 = QApplication::wheelScrollLines();
    fVar5 = this->offset_accumulated;
    if (((fVar5 != 0.0) || (NAN(fVar5))) && (fVar1 / fVar5 < 0.0)) {
      fVar5 = 0.0;
    }
    fVar5 = (float)this->singleStep * (float)iVar3 * fVar1 + fVar5;
    iVar3 = this->pageStep;
    iVar4 = -iVar3;
    iVar2 = (int)fVar5;
    if (iVar3 < (int)fVar5) {
      iVar2 = iVar3;
    }
    if (iVar2 == iVar4 || SBORROW4(iVar2,iVar4) != iVar2 + iVar3 < 0) {
      iVar2 = iVar4;
    }
    fVar5 = fVar5 - (float)(int)fVar5;
    this->offset_accumulated = fVar5;
    if (iVar2 == 0) {
      if ((this->field_0x27c & 0x10) != 0) {
        fVar5 = -fVar5;
      }
      if ((0.0 < fVar5) && (this->value < this->maximum)) {
        return true;
      }
      if ((fVar5 < 0.0) && (*(int *)&(this->super_QWidgetPrivate).field_0x254 < this->value)) {
        return true;
      }
      goto LAB_003c283c;
    }
  }
  else {
    iVar3 = this->pageStep;
    iVar4 = -iVar3;
    iVar2 = (int)(fVar1 * (float)iVar3);
    if (iVar3 < (int)(fVar1 * (float)iVar3)) {
      iVar2 = iVar3;
    }
    if (iVar2 == iVar4 || SBORROW4(iVar2,iVar4) != iVar2 + iVar3 < 0) {
      iVar2 = iVar4;
    }
    this->offset_accumulated = 0.0;
  }
  iVar3 = -iVar2;
  if ((this->field_0x27c & 0x10) == 0) {
    iVar3 = iVar2;
  }
  iVar2 = this->value;
  iVar3 = (**(code **)(*(long *)&this->super_QWidgetPrivate + 0xa8))(this,iVar3 + iVar2);
  this->position = iVar3;
  QAbstractSlider::triggerAction(this_00,SliderMove);
  if (iVar2 != this->value) {
    return true;
  }
LAB_003c283c:
  this->offset_accumulated = 0.0;
  return false;
}

Assistant:

bool QAbstractSliderPrivate::scrollByDelta(Qt::Orientation orientation, Qt::KeyboardModifiers modifiers, int delta)
{
    Q_Q(QAbstractSlider);
    int stepsToScroll = 0;
    // in Qt scrolling to the right gives negative values.
    if (orientation == Qt::Horizontal)
        delta = -delta;
    qreal offset = qreal(delta) / 120;

    if ((modifiers & Qt::ControlModifier) || (modifiers & Qt::ShiftModifier)) {
        // Scroll one page regardless of delta:
        stepsToScroll = qBound(-pageStep, int(offset * pageStep), pageStep);
        offset_accumulated = 0;
    } else {
        // Calculate how many lines to scroll. Depending on what delta is (and
        // offset), we might end up with a fraction (e.g. scroll 1.3 lines). We can
        // only scroll whole lines, so we keep the reminder until next event.
        qreal stepsToScrollF =
#if QT_CONFIG(wheelevent)
                QApplication::wheelScrollLines() *
#endif
                offset * effectiveSingleStep();
        // Check if wheel changed direction since last event:
        if (offset_accumulated != 0 && (offset / offset_accumulated) < 0)
            offset_accumulated = 0;

        offset_accumulated += stepsToScrollF;

        // Don't scroll more than one page in any case:
        stepsToScroll = qBound(-pageStep, int(offset_accumulated), pageStep);

        offset_accumulated -= int(offset_accumulated);
        if (stepsToScroll == 0) {
            // We moved less than a line, but might still have accumulated partial scroll,
            // unless we already are at one of the ends.
            const float effective_offset = invertedControls ? -offset_accumulated : offset_accumulated;
            if (effective_offset > 0.f && value < maximum)
                return true;
            if (effective_offset < 0.f && value > minimum)
                return true;
            offset_accumulated = 0;
            return false;
        }
    }

    if (invertedControls)
        stepsToScroll = -stepsToScroll;

    int prevValue = value;
    position = bound(overflowSafeAdd(stepsToScroll)); // value will be updated by triggerAction()
    q->triggerAction(QAbstractSlider::SliderMove);

    if (prevValue == value) {
        offset_accumulated = 0;
        return false;
    }
    return true;
}